

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

parser_error parse_room_flags(parser *p)

{
  errr eVar1;
  void *pvVar2;
  char *pcVar3;
  bool bVar4;
  char *local_30;
  char *st;
  char *s;
  room_template *t;
  parser *p_local;
  
  pvVar2 = parser_priv(p);
  if (pvVar2 == (void *)0x0) {
    p_local._4_4_ = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    pcVar3 = parser_getstr(p,"flags");
    pcVar3 = string_make(pcVar3);
    local_30 = strtok(pcVar3," |");
    while( true ) {
      bVar4 = false;
      if (local_30 != (char *)0x0) {
        eVar1 = grab_flag((bitflag *)((long)pvVar2 + 0x18),1,room_flags,local_30);
        bVar4 = eVar1 == 0;
      }
      if (!bVar4) break;
      local_30 = strtok((char *)0x0," |");
    }
    mem_free(pcVar3);
    p_local._4_4_ = PARSE_ERROR_NONE;
    if (local_30 != (char *)0x0) {
      p_local._4_4_ = PARSE_ERROR_INVALID_FLAG;
    }
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_room_flags(struct parser *p) {
	struct room_template *t = parser_priv(p);
	char *s, *st;

	if (!t)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	s = string_make(parser_getstr(p, "flags"));
	st = strtok(s, " |");
	while (st && !grab_flag(t->flags, ROOMF_SIZE, room_flags, st)) {
		st = strtok(NULL, " |");
	}
	mem_free(s);

	return st ? PARSE_ERROR_INVALID_FLAG : PARSE_ERROR_NONE;
}